

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  int iVar1;
  uint64_t uVar2;
  int in_ESI;
  secp256k1_scalar *in_RDI;
  secp256k1_uint128 t;
  uint64_t nonzero;
  uint64_t mask;
  int vflag;
  secp256k1_uint128 sStack_38;
  ulong local_20;
  ulong local_18;
  secp256k1_scalar *local_8;
  
  local_18 = (ulong)-in_ESI;
  local_8 = in_RDI;
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x10b7f8e);
  local_20 = (ulong)(int)((iVar1 != 0) - 1);
  secp256k1_scalar_verify(local_8);
  secp256k1_u128_from_u64(&sStack_38,local_8->d[0] ^ local_18);
  secp256k1_u128_accum_u64(&sStack_38,local_18 & 0xbfd25e8cd0364142);
  uVar2 = secp256k1_u128_to_u64(&sStack_38);
  local_8->d[0] = uVar2 & local_20;
  secp256k1_u128_rshift(&sStack_38,0x40);
  secp256k1_u128_accum_u64(&sStack_38,local_8->d[1] ^ local_18);
  secp256k1_u128_accum_u64(&sStack_38,local_18 & 0xbaaedce6af48a03b);
  uVar2 = secp256k1_u128_to_u64(&sStack_38);
  local_8->d[1] = uVar2 & local_20;
  secp256k1_u128_rshift(&sStack_38,0x40);
  secp256k1_u128_accum_u64(&sStack_38,local_8->d[2] ^ local_18);
  secp256k1_u128_accum_u64(&sStack_38,local_18 & 0xfffffffffffffffe);
  uVar2 = secp256k1_u128_to_u64(&sStack_38);
  local_8->d[2] = uVar2 & local_20;
  secp256k1_u128_rshift(&sStack_38,0x40);
  secp256k1_u128_accum_u64(&sStack_38,local_8->d[3] ^ local_18);
  secp256k1_u128_accum_u64(&sStack_38,local_18);
  uVar2 = secp256k1_u128_to_u64(&sStack_38);
  local_8->d[3] = uVar2 & local_20;
  secp256k1_scalar_verify(local_8);
  return (uint)(local_18 == 0) * 2 + -1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    volatile int vflag = flag;
    uint64_t mask = -vflag;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(r);

    secp256k1_u128_from_u64(&t, r->d[0] ^ mask);
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_0 + 1) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3 & mask);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
    return 2 * (mask == 0) - 1;
}